

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.cpp
# Opt level: O3

void Ptex::v2_2::anon_unknown_4::ApplyN<Ptex::v2_2::PtexHalf>
               (PtexSeparableKernel *k,float *result,void *data,int nChan,int nTxChan)

{
  void *pvVar1;
  void *pvVar2;
  float fVar3;
  byte bVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  float *pfVar9;
  void *pvVar10;
  int iVar11;
  float *pfVar12;
  long lVar13;
  int iVar14;
  float afStack_58 [2];
  void *local_50;
  long local_48;
  float *local_40;
  int local_34;
  
  uVar5 = (ulong)(uint)nChan;
  lVar6 = -0x58 - ((long)nChan * 4 + 0xfU & 0xfffffffffffffff0);
  bVar4 = (k->res).ulog2;
  local_34 = nTxChan;
  iVar14 = nTxChan << (bVar4 & 0x1f);
  lVar7 = (long)iVar14 * (long)k->vw;
  if ((int)lVar7 != 0) {
    pvVar10 = (void *)((long)data + (long)(((k->v << (bVar4 & 0x1f)) + k->u) * nTxChan) * 2);
    local_50 = (void *)((long)pvVar10 + lVar7 * 2);
    local_40 = k->ku;
    pfVar12 = k->kv;
    lVar13 = (long)nTxChan;
    lVar7 = k->uw * lVar13;
    iVar11 = (int)lVar7;
    local_48 = (long)(iVar14 - iVar11);
    do {
      if (0 < nChan) {
        fVar3 = *local_40;
        uVar8 = 0;
        do {
          *(float *)((long)afStack_58 + uVar8 * 4 + lVar6 + 0x58) =
               *(float *)(PtexHalf::h2fTable + (ulong)*(ushort *)((long)pvVar10 + uVar8 * 2) * 4) *
               fVar3;
          uVar8 = uVar8 + 1;
        } while (uVar5 != uVar8);
      }
      if (iVar11 != local_34) {
        pvVar1 = (void *)((long)pvVar10 + lVar7 * 2);
        pfVar9 = local_40;
        pvVar2 = (void *)((long)pvVar10 + lVar13 * 2);
        do {
          pvVar10 = pvVar2;
          if (0 < nChan) {
            fVar3 = pfVar9[1];
            uVar8 = 0;
            do {
              *(float *)((long)afStack_58 + uVar8 * 4 + lVar6 + 0x58) =
                   *(float *)(PtexHalf::h2fTable + (ulong)*(ushort *)((long)pvVar10 + uVar8 * 2) * 4
                             ) * fVar3 + *(float *)((long)afStack_58 + uVar8 * 4 + lVar6 + 0x58);
              uVar8 = uVar8 + 1;
            } while (uVar5 != uVar8);
          }
          pfVar9 = pfVar9 + 1;
          pvVar2 = (void *)((long)pvVar10 + lVar13 * 2);
        } while (pvVar2 != pvVar1);
      }
      if (0 < nChan) {
        fVar3 = *pfVar12;
        uVar8 = 0;
        do {
          result[uVar8] =
               *(float *)((long)afStack_58 + uVar8 * 4 + lVar6 + 0x58) * fVar3 + result[uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar5 != uVar8);
      }
      pfVar12 = pfVar12 + 1;
      pvVar10 = (void *)((long)pvVar10 + local_48 * 2 + lVar13 * 2);
    } while (pvVar10 != local_50);
  }
  return;
}

Assistant:

void ApplyN(PtexSeparableKernel& k, float* result, void* data, int nChan, int nTxChan)
    {
        float* rowResult = (float*) alloca(nChan*sizeof(float));
        int rowlen = k.res.u() * nTxChan;
        int datalen = k.uw * nTxChan;
        int rowskip = rowlen - datalen;
        float* kvp = k.kv;
        T* p = static_cast<T*>(data) + (k.v * k.res.u() + k.u) * nTxChan;
        T* pEnd = p + k.vw * rowlen;
        while (p != pEnd)
        {
            float* kup = k.ku;
            T* pRowEnd = p + datalen;
            // just mult and copy first element
            PtexUtils::VecMultN<T>()(rowResult, p, nChan, *kup++);
            p += nTxChan;
            // accumulate remaining elements
            while (p != pRowEnd) {
                // rowResult[i] = p[i] * ku[u] for i in {0..n-1}
                PtexUtils::VecAccumN<T>()(rowResult, p, nChan, *kup++);
                p += nTxChan;
            }
            // result[i] += rowResult[i] * kv[v] for i in {0..n-1}
            PtexUtils::VecAccumN<float>()(result, rowResult, nChan, *kvp++);
            p += rowskip;
        }
    }